

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToValue_TestShell::
TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToValue_TestShell
          (TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToValue_TestShell
           *this)

{
  TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToValue_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndFailsDueToValue_TestShell_0035d0b8
  ;
  return;
}

Assistant:

TEST(MockParameterTest, expectOneUnsignedIntegerParameterAndFailsDueToValue)
{
    MockFailureReporterInstaller failureReporterInstaller;

    unsigned int actual_value = 8;
    unsigned int expected_value = actual_value + 1;
    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", expected_value);
    MockNamedValue parameter("parameter");
    parameter.setValue(actual_value);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", expected_value);
    mock().actualCall("foo").withParameter("parameter", actual_value);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}